

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Axis.cpp
# Opt level: O1

Twist * __thiscall
iDynTree::Axis::getTranslationTwist(Twist *__return_storage_ptr__,Axis *this,double ddist)

{
  double dVar1;
  PointerType ptr;
  
  Twist::Twist(__return_storage_ptr__);
  dVar1 = (this->direction).super_Vector3.m_data[1];
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[0] =
       ddist * (this->direction).super_Vector3.m_data[0];
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[1] =
       ddist * dVar1;
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[2] =
       ddist * (this->direction).super_Vector3.m_data[2];
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[0] = 0.0;
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[1] = 0.0;
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[2] = 0.0;
  return __return_storage_ptr__;
}

Assistant:

Twist Axis::getTranslationTwist(const double ddist) const
    {
        Twist ret;

        Eigen::Map<Eigen::Vector3d> linVel(ret.getLinearVec3().data());
        Eigen::Map<Eigen::Vector3d> angVel(ret.getAngularVec3().data());

        Eigen::Map<const Eigen::Vector3d> dir(direction.data());
        Eigen::Map<const Eigen::Vector3d> orig(origin.data());

        linVel = dir*ddist;
        angVel << 0,0,0;

        return ret;
    }